

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

Config * Config::load(string *file)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  invalid_argument *this;
  Value *v;
  Config *in_RDI;
  string *in_stack_00000070;
  Value *in_stack_000000a8;
  Nanomsg *in_stack_000000b0;
  char *decoderStatsEndpoint;
  char *demodulatorStatsEndpoint;
  Value *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>
  *it;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  *table;
  ParseResult pr;
  Config *out;
  undefined6 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  Config *in_stack_fffffffffffffeb0;
  Config *this_00;
  undefined5 in_stack_fffffffffffffed8;
  RTLSDR *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  Config *v_00;
  Decoder *in_stack_ffffffffffffff10;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  char *local_a0;
  char *local_98;
  Value *local_90;
  reference local_88;
  reference local_80;
  _Self local_78;
  _Self local_70;
  Value *local_68;
  Value *local_60;
  string local_38 [39];
  byte local_11;
  
  local_11 = 0;
  v_00 = in_RDI;
  Config(in_stack_fffffffffffffeb0);
  toml::parseFile((string *)pr._40_8_);
  uVar1 = toml::ParseResult::valid((ParseResult *)0x17a725);
  if ((bool)uVar1) {
    v = (Value *)toml::Value::
                 as<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                           ((Value *)in_stack_fffffffffffffeb0);
    local_68 = v;
    local_60 = v;
    local_70._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                  *)CONCAT17(in_stack_fffffffffffffeaf,
                             CONCAT16(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8)));
    local_78._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                *)CONCAT17(in_stack_fffffffffffffeaf,
                           CONCAT16(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8)));
    while (bVar2 = std::operator!=(&local_70,&local_78), bVar2) {
      local_88 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>
                 ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>
                              *)0x17a855);
      local_90 = &local_88->second;
      local_80 = local_88;
      uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffeb0,
                              (char *)CONCAT17(in_stack_fffffffffffffeaf,
                                               CONCAT16(in_stack_fffffffffffffeae,
                                                        in_stack_fffffffffffffea8)));
      if ((bool)uVar3) {
        anon_unknown.dwarf_16fd8::loadDemodulator
                  (&in_RDI->demodulator,(Value *)CONCAT17(uVar1,in_stack_fffffffffffffef8));
      }
      else {
        uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffeb0,
                                (char *)CONCAT17(in_stack_fffffffffffffeaf,
                                                 CONCAT16(in_stack_fffffffffffffeae,
                                                          in_stack_fffffffffffffea8)));
        if ((bool)uVar4) {
          anon_unknown.dwarf_16fd8::loadAirspySource((Airspy *)in_stack_fffffffffffffef0,v);
        }
        else {
          uVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffeb0,
                                  (char *)CONCAT17(in_stack_fffffffffffffeaf,
                                                   CONCAT16(in_stack_fffffffffffffeae,
                                                            in_stack_fffffffffffffea8)));
          if ((bool)uVar5) {
            anon_unknown.dwarf_16fd8::loadRTLSDRSource(in_stack_fffffffffffffef0,v);
          }
          else {
            uVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffeb0,
                                    (char *)CONCAT17(in_stack_fffffffffffffeaf,
                                                     CONCAT16(in_stack_fffffffffffffeae,
                                                              in_stack_fffffffffffffea8)));
            if ((bool)uVar6) {
              anon_unknown.dwarf_16fd8::loadNanomsgSource(in_stack_000000b0,in_stack_000000a8);
            }
            else {
              uVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffeb0,
                                      (char *)CONCAT17(in_stack_fffffffffffffeaf,
                                                       CONCAT16(in_stack_fffffffffffffeae,
                                                                in_stack_fffffffffffffea8)));
              if ((bool)uVar7) {
                anon_unknown.dwarf_16fd8::loadAGC((AGC *)in_stack_fffffffffffffef0,v);
              }
              else {
                uVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffffeb0,
                                        (char *)CONCAT17(in_stack_fffffffffffffeaf,
                                                         CONCAT16(in_stack_fffffffffffffeae,
                                                                  in_stack_fffffffffffffea8)));
                if ((bool)uVar8) {
                  anon_unknown.dwarf_16fd8::loadCostas
                            ((Costas *)in_RDI,(Value *)CONCAT17(uVar1,in_stack_fffffffffffffef8));
                }
                else {
                  uVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_fffffffffffffeb0,
                                          (char *)CONCAT17(in_stack_fffffffffffffeaf,
                                                           CONCAT16(in_stack_fffffffffffffeae,
                                                                    in_stack_fffffffffffffea8)));
                  if ((bool)uVar9) {
                    anon_unknown.dwarf_16fd8::loadRRC((RRC *)in_stack_fffffffffffffef0,v);
                  }
                  else {
                    uVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)in_stack_fffffffffffffeb0,
                                             (char *)CONCAT17(in_stack_fffffffffffffeaf,
                                                              CONCAT16(in_stack_fffffffffffffeae,
                                                                       in_stack_fffffffffffffea8)));
                    if ((bool)uVar10) {
                      anon_unknown.dwarf_16fd8::loadClockRecovery
                                ((ClockRecovery *)in_stack_fffffffffffffef0,v);
                    }
                    else {
                      uVar11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)in_stack_fffffffffffffeb0,
                                               (char *)CONCAT17(in_stack_fffffffffffffeaf,
                                                                CONCAT16(in_stack_fffffffffffffeae,
                                                                         in_stack_fffffffffffffea8))
                                              );
                      if ((bool)uVar11) {
                        anon_unknown.dwarf_16fd8::loadQuantization
                                  ((Quantization *)in_stack_fffffffffffffef0,v);
                      }
                      else {
                        uVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffeb0,
                                                 (char *)CONCAT17(in_stack_fffffffffffffeaf,
                                                                  CONCAT16(in_stack_fffffffffffffeae
                                                                           ,
                                                  in_stack_fffffffffffffea8)));
                        if ((bool)uVar12) {
                          anon_unknown.dwarf_16fd8::loadDecoder
                                    (in_stack_ffffffffffffff10,(Value *)v_00);
                        }
                        else {
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffeb0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffeaf,
                                                                   CONCAT16(
                                                  in_stack_fffffffffffffeae,
                                                  in_stack_fffffffffffffea8)));
                          if (bVar2) {
                            anon_unknown.dwarf_16fd8::loadMonitor
                                      ((Monitor *)
                                       CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(uVar5,CONCAT14(uVar6,
                                                  CONCAT13(uVar7,CONCAT12(uVar8,CONCAT11(uVar9,
                                                  uVar10))))))),
                                       (Value *)CONCAT17(uVar11,CONCAT16(uVar12,CONCAT15(bVar2,
                                                  in_stack_fffffffffffffed8))));
                          }
                          else {
                            anon_unknown.dwarf_16fd8::throwInvalidKey(in_stack_00000070);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>
                    *)in_stack_fffffffffffffeb0);
    }
    local_98 = "inproc://demodulator_stats";
    local_a0 = "inproc://decoder_stats";
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"inproc://demodulator_stats",&local_c1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffeb0,
                (value_type *)
                CONCAT17(in_stack_fffffffffffffeaf,
                         CONCAT16(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8)));
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    this_00 = (Config *)&(in_RDI->decoder).statsPublisher;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_e8,"inproc://decoder_stats",(allocator *)&stack0xffffffffffffff17);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,
                (value_type *)
                CONCAT17(in_stack_fffffffffffffeaf,
                         CONCAT16(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8)));
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff17);
    uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this_00,(char *)CONCAT17(in_stack_fffffffffffffeaf,
                                                     CONCAT16(in_stack_fffffffffffffeae,
                                                              in_stack_fffffffffffffea8)));
    if ((bool)uVar1) {
      anon_unknown.dwarf_16fd8::setIfZero<unsigned_int>(&(in_RDI->airspy).frequency,0x64ca9cc0);
      anon_unknown.dwarf_16fd8::setIfZero<unsigned_int>(&(in_RDI->rtlsdr).frequency,0x64ca9cc0);
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this_00,(char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffeae,
                                                                    in_stack_fffffffffffffea8)));
    if (bVar2) {
      anon_unknown.dwarf_16fd8::setIfZero<unsigned_int>(&(in_RDI->airspy).frequency,0x64f9ea20);
      anon_unknown.dwarf_16fd8::setIfZero<unsigned_int>(&(in_RDI->rtlsdr).frequency,0x64f9ea20);
    }
    local_11 = 1;
    toml::ParseResult::~ParseResult((ParseResult *)this_00);
    if ((local_11 & 1) == 0) {
      ~Config(this_00);
    }
    return v_00;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,local_38);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Config Config::load(const std::string& file) {
  Config out;

  auto pr = toml::parseFile(file);
  if (!pr.valid()) {
    throw std::invalid_argument(pr.errorReason);
  }

  const auto& table = pr.value.as<toml::Table>();
  for (const auto& it : table) {
    const auto& key = it.first;
    const auto& value = it.second;

    if (key == "demodulator") {
      loadDemodulator(out.demodulator, value);
      continue;
    }

    if (key == "airspy") {
      loadAirspySource(out.airspy, value);
      continue;
    }

    if (key == "rtlsdr") {
      loadRTLSDRSource(out.rtlsdr, value);
      continue;
    }

    if (key == "nanomsg") {
      loadNanomsgSource(out.nanomsg, value);
      continue;
    }

    if (key == "agc") {
      loadAGC(out.agc, value);
      continue;
    }

    if (key == "costas") {
      loadCostas(out.costas, value);
      continue;
    }

    if (key == "rrc") {
      loadRRC(out.rrc, value);
      continue;
    }

    if (key == "clock_recovery") {
      loadClockRecovery(out.clockRecovery, value);
      continue;
    }

    if (key == "quantization") {
      loadQuantization(out.quantization, value);
      continue;
    }

    if (key == "decoder") {
      loadDecoder(out.decoder, value);
      continue;
    }

    if (key == "monitor") {
      loadMonitor(out.monitor, value);
      continue;
    }

    throwInvalidKey(key);
  }

  const auto demodulatorStatsEndpoint = "inproc://demodulator_stats";
  const auto decoderStatsEndpoint = "inproc://decoder_stats";

  // Add inproc endpoints for the stats publishers
  out.demodulator.statsPublisher.bind.push_back(demodulatorStatsEndpoint);
  out.decoder.statsPublisher.bind.push_back(decoderStatsEndpoint);

  // If the mode field is used, we can populate sane defaults
  if (out.demodulator.downlinkType == "lrit") {
    setIfZero(out.airspy.frequency, 1691000000u);
    setIfZero(out.rtlsdr.frequency, 1691000000u);
  }
  if (out.demodulator.downlinkType == "hrit") {
    setIfZero(out.airspy.frequency, 1694100000u);
    setIfZero(out.rtlsdr.frequency, 1694100000u);
  }

  return out;
}